

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# islamcal.cpp
# Opt level: O0

int32_t __thiscall
icu_63::IslamicCalendar::handleGetMonthLength
          (IslamicCalendar *this,int32_t extendedYear,int32_t month)

{
  UBool UVar1;
  int32_t iVar2;
  int32_t iVar3;
  int iVar4;
  int local_1c;
  int32_t length;
  int32_t month_local;
  int32_t extendedYear_local;
  IslamicCalendar *this_local;
  
  if (((*(int *)&(this->super_Calendar).field_0x264 == 1) ||
      (*(int *)&(this->super_Calendar).field_0x264 == 3)) ||
     ((*(int *)&(this->super_Calendar).field_0x264 == 2 &&
      ((extendedYear < 0x514 || (0x640 < extendedYear)))))) {
    iVar4 = (month + 1) % 2;
    local_1c = iVar4 + 0x1d;
    if ((month == 0xb) && (UVar1 = civilLeapYear(extendedYear), UVar1 != '\0')) {
      local_1c = iVar4 + 0x1e;
    }
  }
  else if (*(int *)&(this->super_Calendar).field_0x264 == 0) {
    iVar4 = (extendedYear + -1) * 0xc + month;
    iVar2 = trueMonthStart(this,iVar4 + 1);
    iVar3 = trueMonthStart(this,iVar4);
    local_1c = iVar2 - iVar3;
  }
  else {
    local_1c = getUmalqura_MonthLength(extendedYear + -0x514,month);
  }
  return local_1c;
}

Assistant:

int32_t IslamicCalendar::handleGetMonthLength(int32_t extendedYear, int32_t month) const {

    int32_t length = 0;

    if (cType == CIVIL || cType == TBLA ||
        (cType == UMALQURA && (extendedYear<UMALQURA_YEAR_START || extendedYear>UMALQURA_YEAR_END)) ) {
        length = 29 + (month+1) % 2;
        if (month == DHU_AL_HIJJAH && civilLeapYear(extendedYear)) {
            length++;
        }
    } else if(cType == ASTRONOMICAL){
        month = 12*(extendedYear-1) + month;
        length =  trueMonthStart(month+1) - trueMonthStart(month) ;
    } else {
        length = getUmalqura_MonthLength(extendedYear - UMALQURA_YEAR_START, month);
    }
    return length;
}